

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O2

void __thiscall IRC_Bot::~IRC_Bot(IRC_Bot *this)

{
  *(undefined ***)this = &PTR_think_00119ad8;
  if (IRCCommand::selected_server == this) {
    IRCCommand::selected_server = (IRC_Bot *)0x0;
  }
  if (IRCCommand::active_server == this) {
    IRCCommand::active_server = IRCCommand::selected_server;
  }
  std::__cxx11::string::~string((string *)&this->m_commandPrefix);
  std::
  vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ::~vector(&this->m_commands);
  Jupiter::IRC::Client::~Client(&this->super_Client);
  return;
}

Assistant:

IRC_Bot::~IRC_Bot() {
	if (IRCCommand::selected_server == this) {
		IRCCommand::selected_server = nullptr;
	}

	if (IRCCommand::active_server == this) {
		IRCCommand::active_server = IRCCommand::selected_server;
	}
}